

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxScript.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Script::SetVariableAtIndex(Script *this,RuntimeID id,size_t index)

{
  ulong uVar1;
  reverse_iterator rVar2;
  bool bVar3;
  size_type sVar4;
  pointer pIVar5;
  size_type local_38;
  undefined1 local_30 [16];
  reverse_iterator ritr;
  size_t index_local;
  RuntimeID id_local;
  Script *this_local;
  
  ritr.current._M_current =
       (__normal_iterator<Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>
        )(__normal_iterator<Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>
          )index;
  index_local = id;
  id_local = (RuntimeID)this;
  sVar4 = std::vector<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>::size
                    (&this->m_stack);
  if (sVar4 <= index) {
    __assert_fail("index < m_stack.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxScript.cpp"
                  ,0x4bf,"void Jinx::Impl::Script::SetVariableAtIndex(RuntimeID, size_t)");
  }
  std::
  vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
  ::rbegin((vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
            *)(local_30 + 8));
  while( true ) {
    std::
    vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
    ::rend((vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
            *)local_30);
    bVar3 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>_>
                             *)(local_30 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>_>
                             *)local_30);
    if (!bVar3) break;
    pIVar5 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>_>
                           *)(local_30 + 8));
    uVar1 = pIVar5->frameIndex;
    sVar4 = std::
            vector<Jinx::Impl::Script::ExecutionFrame,_Jinx::StaticAllocator<Jinx::Impl::Script::ExecutionFrame,_4096UL,_16UL>_>
            ::size(&this->m_execution);
    if (uVar1 < sVar4) break;
    pIVar5 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>_>
                           *)(local_30 + 8));
    rVar2 = ritr;
    if (pIVar5->id == index_local) {
      pIVar5 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>_>
                             *)(local_30 + 8));
      pIVar5->index = (size_t)rVar2.current._M_current;
      return;
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>_>
                  *)(local_30 + 8));
  }
  local_38 = std::
             vector<Jinx::Impl::Script::ExecutionFrame,_Jinx::StaticAllocator<Jinx::Impl::Script::ExecutionFrame,_4096UL,_16UL>_>
             ::size(&this->m_execution);
  std::
  vector<Jinx::Impl::Script::IdIndexData,Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,4096ul,16ul>>
  ::emplace_back<unsigned_long&,unsigned_long&,unsigned_long>
            ((vector<Jinx::Impl::Script::IdIndexData,Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,4096ul,16ul>>
              *)&this->m_idIndexData,&index_local,(unsigned_long *)&ritr,&local_38);
  return;
}

Assistant:

inline_t void Script::SetVariableAtIndex(RuntimeID id, size_t index)
	{
		assert(index < m_stack.size());
		for (auto ritr = m_idIndexData.rbegin(); ritr != m_idIndexData.rend(); ++ritr)
		{
			if (ritr->frameIndex < m_execution.size())
				break;
			if (ritr->id == id)
			{
				ritr->index = index;
				return;
			}
		}
		m_idIndexData.emplace_back(id, index, m_execution.size());
	}